

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void copy_stemmer(char *zIn,int nIn,char *zOut,int *pnOut)

{
  char cVar1;
  bool bVar2;
  int iStack_34;
  char c;
  int hasDigit;
  int j;
  int mx;
  int i;
  int *pnOut_local;
  char *zOut_local;
  int nIn_local;
  char *zIn_local;
  
  bVar2 = false;
  for (j = 0; j < nIn; j = j + 1) {
    cVar1 = zIn[j];
    if ((cVar1 < 'A') || ('Z' < cVar1)) {
      if (('/' < cVar1) && (cVar1 < ':')) {
        bVar2 = true;
      }
      zOut[j] = cVar1;
    }
    else {
      zOut[j] = cVar1 + ' ';
    }
  }
  iStack_34 = 10;
  if (bVar2) {
    iStack_34 = 3;
  }
  if (nIn != iStack_34 * 2 && SBORROW4(nIn,iStack_34 * 2) == nIn + iStack_34 * -2 < 0) {
    for (j = nIn - iStack_34; j < nIn; j = j + 1) {
      zOut[iStack_34] = zOut[j];
      iStack_34 = iStack_34 + 1;
    }
    j = iStack_34;
  }
  zOut[j] = '\0';
  *pnOut = j;
  return;
}

Assistant:

static void copy_stemmer(const char *zIn, int nIn, char *zOut, int *pnOut){
  int i, mx, j;
  int hasDigit = 0;
  for(i=0; i<nIn; i++){
    char c = zIn[i];
    if( c>='A' && c<='Z' ){
      zOut[i] = c - 'A' + 'a';
    }else{
      if( c>='0' && c<='9' ) hasDigit = 1;
      zOut[i] = c;
    }
  }
  mx = hasDigit ? 3 : 10;
  if( nIn>mx*2 ){
    for(j=mx, i=nIn-mx; i<nIn; i++, j++){
      zOut[j] = zOut[i];
    }
    i = j;
  }
  zOut[i] = 0;
  *pnOut = i;
}